

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O3

void xmlSchemaSetValidStructuredErrors
               (xmlSchemaValidCtxtPtr ctxt,xmlStructuredErrorFunc serror,void *ctx)

{
  xmlSchemaValidCtxtPtr pxVar1;
  xmlSchemaParserCtxtPtr pxVar2;
  
  if (ctxt != (xmlSchemaValidCtxtPtr)0x0) {
    ctxt->serror = serror;
    ctxt->error = (xmlSchemaValidityErrorFunc)0x0;
    ctxt->warning = (xmlSchemaValidityWarningFunc)0x0;
    ctxt->errCtxt = ctx;
    pxVar2 = ctxt->pctxt;
    while (pxVar2 != (xmlSchemaParserCtxtPtr)0x0) {
      pxVar2->serror = serror;
      pxVar2->errCtxt = ctx;
      pxVar1 = pxVar2->vctxt;
      if (pxVar1 == (xmlSchemaValidCtxtPtr)0x0) {
        return;
      }
      pxVar1->serror = serror;
      pxVar1->error = (xmlSchemaValidityErrorFunc)0x0;
      pxVar1->warning = (xmlSchemaValidityWarningFunc)0x0;
      pxVar1->errCtxt = ctx;
      pxVar2 = pxVar1->pctxt;
    }
  }
  return;
}

Assistant:

void
xmlSchemaSetValidStructuredErrors(xmlSchemaValidCtxtPtr ctxt,
				  xmlStructuredErrorFunc serror, void *ctx)
{
    if (ctxt == NULL)
        return;
    ctxt->serror = serror;
    ctxt->error = NULL;
    ctxt->warning = NULL;
    ctxt->errCtxt = ctx;
    if (ctxt->pctxt != NULL)
	xmlSchemaSetParserStructuredErrors(ctxt->pctxt, serror, ctx);
}